

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BenchmarkSuite.cpp
# Opt level: O3

void __thiscall
benchmarks::BenchmarkSuite::InvokeBenchmark
          (BenchmarkSuite *this,int64_t iterations,ParameterizedBenchmarkId *id,
          IBenchmarksResultsReporterPtr *resultsReporter)

{
  LoggerWriter *pLVar1;
  iterator iVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  long *local_230;
  long local_228;
  long local_220;
  long lStack_218;
  string local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  undefined1 local_1d0 [32];
  _Alloc_hider local_1b0;
  char local_1a0 [16];
  _Alloc_hider local_190;
  char local_180 [336];
  
  NamedLogger::LoggerWriter::LoggerWriter((LoggerWriter *)local_1d0,Debug,(string *)s_logger);
  pLVar1 = NamedLogger::LoggerWriter::operator<<((LoggerWriter *)local_1d0,(char (*) [13])0x1e94a0);
  if ((int)pLVar1->_loggerLogLevel <= (int)pLVar1->_logLevel) {
    std::ostream::_M_insert<long>((long)&pLVar1->field_0x20);
  }
  NamedLogger::LoggerWriter::~LoggerWriter((LoggerWriter *)local_1d0);
  ParameterizedBenchmarkId::GetId((BenchmarkId *)local_1d0,id);
  iVar2 = std::
          _Rb_tree<benchmarks::BenchmarkId,_std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>,_std::_Select1st<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
          ::find((_Rb_tree<benchmarks::BenchmarkId,_std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>,_std::_Select1st<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>,_std::less<benchmarks::BenchmarkId>,_std::allocator<std::pair<const_benchmarks::BenchmarkId,_std::shared_ptr<benchmarks::IBenchmark>_>_>_>
                  *)this,(BenchmarkId *)local_1d0);
  if (local_190._M_p != local_180) {
    operator_delete(local_190._M_p);
  }
  if (local_1b0._M_p != local_1a0) {
    operator_delete(local_1b0._M_p);
  }
  if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
    operator_delete((void *)local_1d0._0_8_);
  }
  if ((_Rb_tree_header *)iVar2._M_node != &(this->_benchmarks)._M_t._M_impl.super__Rb_tree_header) {
    local_1d0._16_8_ =
         (resultsReporter->
         super___shared_ptr<benchmarks::IBenchmarksResultsReporter,_(__gnu_cxx::_Lock_policy)2>).
         _M_ptr;
    local_1d0._24_8_ =
         (resultsReporter->
         super___shared_ptr<benchmarks::IBenchmarksResultsReporter,_(__gnu_cxx::_Lock_policy)2>).
         _M_refcount._M_pi;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_)->_M_use_count =
             ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_)->_M_use_count + 1;
      }
    }
    local_1d0._0_8_ = &PTR__MeasureBenchmarkContext_00217020;
    local_1d0._8_8_ = iterations;
    local_1b0._M_p = (pointer)Memory::GetRss();
    (**(code **)(**(long **)(iVar2._M_node + 4) + 0x18))
              (*(long **)(iVar2._M_node + 4),local_1d0,&id->_params);
    local_1d0._0_8_ = &PTR__MeasureBenchmarkContext_00217020;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._24_8_);
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  ParameterizedBenchmarkId::GetId((BenchmarkId *)local_1d0,id);
  BenchmarkId::ToString_abi_cxx11_(&local_210,(BenchmarkId *)local_1d0);
  std::operator+(&local_1f0,"Benchmark ",&local_210);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_230 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_230 == plVar4) {
    local_220 = *plVar4;
    lStack_218 = plVar3[3];
    local_230 = &local_220;
  }
  else {
    local_220 = *plVar4;
  }
  local_228 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_230);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void BenchmarkSuite::InvokeBenchmark(int64_t iterations, const ParameterizedBenchmarkId& id, const IBenchmarksResultsReporterPtr& resultsReporter)
	{
		s_logger.Debug() << "iterations: " << iterations;

		auto it = _benchmarks.find(id.GetId());
		if (it == _benchmarks.end())
			throw std::runtime_error("Benchmark " + id.GetId().ToString() + " not found!");

		MeasureBenchmarkContext ctx(iterations, resultsReporter);
		it->second->Perform(ctx, id.GetParams());
	}